

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O1

void idx2::InsertionSort<idx2::sub_channel_info*>(sub_channel_info *Beg,sub_channel_info *End)

{
  sub_channel_info *psVar1;
  sub_channel *psVar2;
  sub_channel *psVar3;
  i8 iVar4;
  undefined6 uVar5;
  i8 iVar6;
  i8 iVar7;
  undefined6 uVar8;
  sub_channel_info *psVar9;
  sub_channel_info *End_00;
  
  End_00 = Beg + 1;
  if (End_00 != End && Beg != End) {
    do {
      psVar9 = BinarySearch<idx2::sub_channel_info,idx2::sub_channel_info*>(Beg,End_00,End_00);
      for (psVar1 = End_00; psVar1 != psVar9; psVar1 = psVar1 + -1) {
        iVar6 = psVar1->Level;
        iVar7 = psVar1->Subband;
        uVar8 = *(undefined6 *)&psVar1->field_0x2;
        psVar2 = psVar1->SubChannel;
        iVar4 = psVar1[-1].Subband;
        uVar5 = *(undefined6 *)&psVar1[-1].field_0x2;
        psVar3 = psVar1[-1].SubChannel;
        psVar1->Level = psVar1[-1].Level;
        psVar1->Subband = iVar4;
        *(undefined6 *)&psVar1->field_0x2 = uVar5;
        psVar1->SubChannel = psVar3;
        psVar1[-1].Level = iVar6;
        psVar1[-1].Subband = iVar7;
        *(undefined6 *)&psVar1[-1].field_0x2 = uVar8;
        psVar1[-1].SubChannel = psVar2;
      }
      End_00 = End_00 + 1;
    } while (End_00 != End);
  }
  return;
}

Assistant:

void
InsertionSort(i Beg, i End)
{
  if (Beg == End)
    return;
  i Last = Beg + 1;
  while (Last != End)
  {
    i Pos = BinarySearch(Beg, Last, *Last);
    for (i It = Last; It != Pos; --It)
      Swap(It, It - 1);
    ++Last;
  }
}